

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_read_pcm_frames_s32be
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int32 *pBufferOut)

{
  uint uVar1;
  ma_uint64 mVar2;
  long lVar3;
  long lVar4;
  
  mVar2 = ma_dr_wav_read_pcm_frames_s32(pWav,framesToRead,pBufferOut);
  if ((pBufferOut != (ma_int32 *)0x0) && (lVar3 = mVar2 * pWav->channels, lVar3 != 0)) {
    lVar4 = 0;
    do {
      uVar1 = pBufferOut[lVar4];
      pBufferOut[lVar4] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar4 = lVar4 + 1;
    } while (lVar3 - lVar4 != 0);
  }
  return mVar2;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s32be(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int32* pBufferOut)
{
    ma_uint64 framesRead = ma_dr_wav_read_pcm_frames_s32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && ma_dr_wav__is_little_endian() == MA_TRUE) {
        ma_dr_wav__bswap_samples_s32(pBufferOut, framesRead*pWav->channels);
    }
    return framesRead;
}